

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::CanIWriteThisFile(cmMakefile *this,string *fileName)

{
  bool bVar1;
  string *psVar2;
  string *psVar3;
  bool local_aa;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *fileName_local;
  cmMakefile *this_local;
  
  local_20 = fileName;
  fileName_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_DISABLE_SOURCE_CHANGES",&local_41);
  bVar1 = IsOn(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    psVar2 = GetHomeDirectory_abi_cxx11_(this);
    psVar3 = GetHomeOutputDirectory_abi_cxx11_(this);
    bVar1 = cmsys::SystemTools::SameFile(psVar2,psVar3);
    psVar2 = local_20;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"CMAKE_DISABLE_IN_SOURCE_BUILD",&local_79);
      bVar1 = IsOn(this,&local_78);
      this_local._7_1_ = (bVar1 ^ 0xffU) & 1;
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
    }
    else {
      psVar3 = GetHomeDirectory_abi_cxx11_(this);
      bVar1 = cmsys::SystemTools::IsSubDirectory(psVar2,psVar3);
      psVar2 = local_20;
      local_aa = true;
      if (bVar1) {
        psVar3 = GetHomeOutputDirectory_abi_cxx11_(this);
        bVar1 = cmsys::SystemTools::IsSubDirectory(psVar2,psVar3);
        psVar2 = local_20;
        local_aa = true;
        if (!bVar1) {
          psVar3 = GetHomeOutputDirectory_abi_cxx11_(this);
          local_aa = cmsys::SystemTools::SameFile(psVar2,psVar3);
        }
      }
      this_local._7_1_ = local_aa;
    }
  }
  else {
    this_local._7_1_ = 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmMakefile::CanIWriteThisFile(std::string const& fileName) const
{
  if (!this->IsOn("CMAKE_DISABLE_SOURCE_CHANGES")) {
    return true;
  }
  // If we are doing an in-source build, then the test will always fail
  if (cmSystemTools::SameFile(this->GetHomeDirectory(),
                              this->GetHomeOutputDirectory())) {
    return !this->IsOn("CMAKE_DISABLE_IN_SOURCE_BUILD");
  }

  return !cmSystemTools::IsSubDirectory(fileName, this->GetHomeDirectory()) ||
    cmSystemTools::IsSubDirectory(fileName, this->GetHomeOutputDirectory()) ||
    cmSystemTools::SameFile(fileName, this->GetHomeOutputDirectory());
}